

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

ElementsDecodeRawTransactionResponseStruct * __thiscall
cfd::api::json::ElementsDecodeRawTransactionResponse::ConvertToStruct
          (ElementsDecodeRawTransactionResponse *this)

{
  long in_RSI;
  ElementsDecodeRawTransactionResponseStruct *in_RDI;
  ElementsDecodeRawTransactionResponseStruct *result;
  JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_ElementsDecodeRawTransactionTxOutStruct>
  *in_stack_00000228;
  JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_ElementsDecodeRawTransactionTxInStruct>
  *in_stack_00000258;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff78;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
  *__x;
  ElementsDecodeRawTransactionResponseStruct *this_01;
  pointer in_stack_ffffffffffffffd0;
  
  this_01 = in_RDI;
  ElementsDecodeRawTransactionResponseStruct::ElementsDecodeRawTransactionResponseStruct
            ((ElementsDecodeRawTransactionResponseStruct *)in_stack_ffffffffffffffd0);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)(in_RSI + 0x38));
  std::__cxx11::string::operator=((string *)&in_RDI->hash,(string *)(in_RSI + 0x58));
  std::__cxx11::string::operator=((string *)&in_RDI->wtxid,(string *)(in_RSI + 0x78));
  std::__cxx11::string::operator=((string *)&in_RDI->withash,(string *)(in_RSI + 0x98));
  in_RDI->version = *(uint32_t *)(in_RSI + 0xb8);
  in_RDI->size = *(int64_t *)(in_RSI + 0xc0);
  in_RDI->vsize = *(int64_t *)(in_RSI + 200);
  in_RDI->weight = *(int64_t *)(in_RSI + 0xd0);
  in_RDI->locktime = *(uint32_t *)(in_RSI + 0xd8);
  core::
  JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_ElementsDecodeRawTransactionTxInStruct>
  ::ConvertToStruct(in_stack_00000258);
  __x = (vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
         *)&stack0xffffffffffffffc0;
  std::
  vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
  ::operator=((vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
               *)this_01,__x);
  std::
  vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
  ::~vector((vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
             *)this_01);
  core::
  JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_ElementsDecodeRawTransactionTxOutStruct>
  ::ConvertToStruct(in_stack_00000228);
  this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xffffffffffffffa8;
  std::
  vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
  ::operator=((vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
               *)this_01,
              (vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
               *)__x);
  std::
  vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
  ::~vector((vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
             *)this_01);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(this_00,in_stack_ffffffffffffff78);
  return this_01;
}

Assistant:

ElementsDecodeRawTransactionResponseStruct ElementsDecodeRawTransactionResponse::ConvertToStruct() const {  // NOLINT
  ElementsDecodeRawTransactionResponseStruct result;
  result.txid = txid_;
  result.hash = hash_;
  result.wtxid = wtxid_;
  result.withash = withash_;
  result.version = version_;
  result.size = size_;
  result.vsize = vsize_;
  result.weight = weight_;
  result.locktime = locktime_;
  result.vin = vin_.ConvertToStruct();
  result.vout = vout_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}